

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

uint16_t get_tx_mask(AV1_COMP *cpi,MACROBLOCK *x,int plane,int block,int blk_row,int blk_col,
                    BLOCK_SIZE plane_bsize,TX_SIZE tx_size,TXB_CTX *txb_ctx,
                    FAST_TX_SEARCH_MODE ftxs_mode,int64_t ref_best_rd,TX_TYPE *allowed_txk_types,
                    int *txk_map)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  int is_inter_00;
  int iVar5;
  int *piVar6;
  int in_EDX;
  undefined8 unaff_RBP;
  long in_RSI;
  long *in_RDI;
  undefined8 unaff_R15;
  MACROBLOCK *unaff_retaddr;
  undefined1 in_stack_00000008;
  undefined7 in_stack_00000009;
  byte in_stack_00000010;
  uint in_stack_00000020;
  BLOCK_SIZE in_stack_00000028;
  byte *in_stack_00000030;
  uint16_t in_stack_00000038;
  int in_stack_00000040;
  TXB_CTX *in_stack_00000048;
  int in_stack_00000050;
  int allowed_tx_count;
  uint16_t prune_2;
  int num_sel;
  uint16_t prune_1;
  int mf;
  int pf;
  int max_idx;
  int max_prob_1;
  uint16_t prune;
  int thresh;
  int i_1;
  int num_allowed;
  uint16_t allowed_tx_mask;
  uint16_t ext_tx_used_flag;
  PREDICTION_MODE intra_dir;
  TX_TYPE uv_tx_type;
  TxSetType tx_set_type;
  int i;
  int tx_type_prob_threshold;
  int max_prob;
  int force_tx_type;
  int *tx_type_probs;
  int use_actual_frame_probs;
  FRAME_UPDATE_TYPE update_type;
  TX_TYPE txk_allowed;
  int fast_tx_search;
  int is_inter;
  TxfmSearchParams *txfm_params;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  AV1_COMP *in_stack_00000178;
  int in_stack_00000190;
  BLOCK_SIZE in_stack_00000198;
  int *in_stack_000001a0;
  int16_t in_stack_000001a8;
  int in_stack_000001b0;
  TXB_CTX *in_stack_000001b8;
  int in_stack_000001c0;
  int64_t in_stack_000001c8;
  int in_stack_000001d0;
  MB_MODE_INFO *in_stack_fffffffffffffed0;
  MACROBLOCKD *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  TX_SIZE tx_size_00;
  int in_stack_fffffffffffffeec;
  undefined8 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  ushort local_e0;
  byte local_dc;
  int local_b8;
  int local_b4;
  ushort local_ae;
  int local_a8;
  int local_a4;
  ushort local_a0;
  ushort local_9e;
  byte local_9a;
  int local_98;
  int local_90;
  int local_8c;
  byte local_79;
  
  tx_size_00 = (TX_SIZE)((uint)in_stack_fffffffffffffee8 >> 0x18);
  lVar1 = **(long **)(in_RSI + 0x2058);
  is_inter_00 = is_inter_block(in_stack_fffffffffffffed0);
  local_79 = 0x10;
  bVar2 = get_frame_update_type((GF_GROUP *)(*in_RDI + 400),(uint)*(byte *)(in_RDI + 0xe258));
  piVar6 = (int *)(*in_RDI + 0x126cc + (ulong)bVar2 * 0x4c0 + (ulong)in_stack_00000010 * 0x40);
  if (((is_inter_00 == 0) && (*(int *)(in_RSI + 0x24dcc) != 0)) ||
     ((is_inter_00 != 0 && (*(int *)(in_RSI + 0x24dd0) == 0)))) {
    local_79 = get_default_tx_type((PLANE_TYPE)((uint)in_stack_fffffffffffffee4 >> 0x10),
                                   in_stack_fffffffffffffed8,
                                   (TX_SIZE)((ulong)in_stack_fffffffffffffed0 >> 0x38),
                                   (int)in_stack_fffffffffffffed0);
  }
  else if ((is_inter_00 == 0) || (*(int *)(in_RSI + 0x24dd0) == 0x7fffffff)) {
    if ((*(char *)(in_RSI + 0x1c63c) == '\x01') && (in_EDX == 0)) {
      local_79 = 0;
    }
  }
  else if (*(int *)(in_RSI + 0x24dd0) < *piVar6) {
    local_79 = 0;
  }
  else {
    local_8c = 0;
    local_90 = 0;
    for (local_98 = 1; local_98 < 0x10; local_98 = local_98 + 1) {
      if (local_90 < piVar6[local_98]) {
        local_90 = piVar6[local_98];
        local_8c = local_98;
      }
    }
    if (*(int *)(in_RSI + 0x24dd0) + 100 < local_90) {
      local_79 = (byte)local_8c;
    }
    else if ((*(char *)(in_RSI + 0x1c63c) == '\x01') && (in_EDX == 0)) {
      local_79 = 0;
    }
  }
  bVar3 = av1_get_ext_tx_set_type
                    (in_stack_00000010,is_inter_00,(uint)(*(byte *)((long)in_RDI + 0x3c175) & 1));
  local_9a = 0;
  if (in_EDX != 0) {
    get_plane_type(in_EDX);
    local_9a = av1_get_tx_type((MACROBLOCKD *)
                               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                               (PLANE_TYPE)((ulong)in_stack_fffffffffffffef0 >> 0x38),
                               (int)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,tx_size_00,
                               in_stack_fffffffffffffee4);
    local_79 = local_9a;
  }
  if (*(char *)(lVar1 + 0x5b) == '\0') {
    local_dc = *(byte *)(lVar1 + 2);
  }
  else {
    local_dc = ""[*(byte *)(lVar1 + 0x5a)];
  }
  if ((*(int *)((long)in_RDI + 0x60be4) == 0) || (bVar3 != 3)) {
    local_e0 = av1_ext_tx_used_flag[bVar3];
  }
  else {
    local_e0 = av1_reduced_intra_tx_used_flag[local_dc];
  }
  local_9e = local_e0;
  if (*(int *)((long)in_RDI + 0x60be4) == 2) {
    local_9e = local_e0 & av1_derived_intra_tx_used_flag[local_dc];
  }
  if ((((*(int *)(in_RSI + 0x2b64 + (ulong)((byte)*(undefined2 *)(lVar1 + 0xa7) & 7) * 4) != 0) ||
       (3 < ""[in_stack_00000010])) || (local_9e == 1)) ||
     (((is_inter_00 != 0 && ((*(byte *)((long)in_RDI + 0x426f5) & 1) != 0)) ||
      ((is_inter_00 == 0 && ((*(byte *)((long)in_RDI + 0x426f4) & 1) != 0)))))) {
    local_79 = 0;
  }
  if ((*(byte *)((long)in_RDI + 0x426f1) & 1) == 0) {
    local_9e = local_9e & 0xf;
  }
  if (local_79 < 0x10) {
    local_a0 = (ushort)(1 << (local_79 & 0x1f)) & local_9e;
  }
  else if ((in_stack_00000020 & 1) == 0) {
    local_a0 = local_9e;
    local_a4 = 0;
    if (*(int *)((long)in_RDI + 0x60bf4) != 0) {
      local_ae = 0;
      local_b4 = -1;
      local_b8 = 0;
      for (local_a8 = 0; local_a8 < 0x10; local_a8 = local_a8 + 1) {
        if ((local_b4 < piVar6[local_a8]) && (((uint)local_9e & 1 << ((byte)local_a8 & 0x1f)) != 0))
        {
          local_b4 = piVar6[local_a8];
          local_b8 = local_a8;
        }
        if (piVar6[local_a8] < get_tx_mask::thresh_arr[*(int *)((long)in_RDI + 0x60bf4) + -1][bVar2]
           ) {
          local_ae = local_ae | (ushort)(1 << ((byte)local_a8 & 0x1f));
        }
      }
      if (((int)(uint)local_ae >> ((byte)local_b8 & 0x1f) & 1U) != 0) {
        local_ae = local_ae & ((ushort)(1 << ((byte)local_b8 & 0x1f)) ^ 0xffff);
      }
      local_a0 = local_9e & (local_ae ^ 0xffff);
    }
    for (local_a8 = 0; local_a8 < 0x10; local_a8 = local_a8 + 1) {
      if (((uint)local_a0 & 1 << ((byte)local_a8 & 0x1f)) != 0) {
        local_a4 = local_a4 + 1;
      }
    }
    if ((local_a4 < 3) || ((int)in_RDI[0xc17f] == 0)) {
      iVar5 = 5;
      if (3 < *(int *)(in_RSI + 0x24dd4)) {
        iVar5 = 1;
      }
      if (((0 < *(int *)(in_RSI + 0x24dd4)) && (is_inter_00 != 0)) && (iVar5 < local_a4)) {
        prune_tx_2D(_fast_tx_search,txk_allowed,update_type,use_actual_frame_probs,
                    tx_type_probs._4_4_,tx_type_probs._3_1_,(TX_TYPE_PRUNE_MODE)mbmi,&xd->mi_row,
                    (uint16_t *)cm);
      }
    }
    else {
      if (local_a4 < 8) {
        uVar4 = prune_txk_type((AV1_COMP *)CONCAT71(in_stack_00000009,in_stack_00000008),
                               unaff_retaddr,(int)((ulong)unaff_RBP >> 0x20),(int)unaff_RBP,
                               (TX_SIZE)((ulong)unaff_R15 >> 0x38),(int)unaff_R15,in_stack_00000020,
                               in_stack_00000028,(int *)in_stack_00000030,in_stack_00000038,
                               in_stack_00000040,in_stack_00000048,in_stack_00000050);
      }
      else {
        uVar4 = prune_txk_type_separ
                          (in_stack_00000178,(MACROBLOCK *)txk_map,allowed_txk_types._4_4_,
                           (int)allowed_txk_types,ref_best_rd._7_1_,(int)ref_best_rd,
                           in_stack_00000190,in_stack_00000198,in_stack_000001a0,in_stack_000001a8,
                           in_stack_000001b0,in_stack_000001b8,in_stack_000001c0,in_stack_000001c8,
                           in_stack_000001d0);
      }
      local_a0 = local_a0 & (uVar4 ^ 0xffff);
    }
  }
  else {
    local_a0 = local_9e & 0xc01;
  }
  if (local_a0 == 0) {
    local_79 = local_9a;
    if (in_EDX == 0) {
      local_79 = 0;
    }
    local_a0 = (ushort)(1 << (local_79 & 0x1f));
  }
  *in_stack_00000030 = local_79;
  return local_a0;
}

Assistant:

static inline uint16_t get_tx_mask(
    const AV1_COMP *cpi, MACROBLOCK *x, int plane, int block, int blk_row,
    int blk_col, BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
    const TXB_CTX *const txb_ctx, FAST_TX_SEARCH_MODE ftxs_mode,
    int64_t ref_best_rd, TX_TYPE *allowed_txk_types, int *txk_map) {
  const AV1_COMMON *cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  const int is_inter = is_inter_block(mbmi);
  const int fast_tx_search = ftxs_mode & FTXS_DCT_AND_1D_DCT_ONLY;
  // if txk_allowed = TX_TYPES, >1 tx types are allowed, else, if txk_allowed <
  // TX_TYPES, only that specific tx type is allowed.
  TX_TYPE txk_allowed = TX_TYPES;

  const FRAME_UPDATE_TYPE update_type =
      get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);
  int use_actual_frame_probs = 1;
  const int *tx_type_probs;
#if CONFIG_FPMT_TEST
  use_actual_frame_probs =
      (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE) ? 0 : 1;
  if (!use_actual_frame_probs) {
    tx_type_probs =
        (int *)cpi->ppi->temp_frame_probs.tx_type_probs[update_type][tx_size];
  }
#endif
  if (use_actual_frame_probs) {
    tx_type_probs = cpi->ppi->frame_probs.tx_type_probs[update_type][tx_size];
  }

  if ((!is_inter && txfm_params->use_default_intra_tx_type) ||
      (is_inter && txfm_params->default_inter_tx_type_prob_thresh == 0)) {
    txk_allowed =
        get_default_tx_type(0, xd, tx_size, cpi->use_screen_content_tools);
  } else if (is_inter &&
             txfm_params->default_inter_tx_type_prob_thresh != INT_MAX) {
    if (tx_type_probs[DEFAULT_INTER_TX_TYPE] >
        txfm_params->default_inter_tx_type_prob_thresh) {
      txk_allowed = DEFAULT_INTER_TX_TYPE;
    } else {
      int force_tx_type = 0;
      int max_prob = 0;
      const int tx_type_prob_threshold =
          txfm_params->default_inter_tx_type_prob_thresh +
          PROB_THRESH_OFFSET_TX_TYPE;
      for (int i = 1; i < TX_TYPES; i++) {  // find maximum probability.
        if (tx_type_probs[i] > max_prob) {
          max_prob = tx_type_probs[i];
          force_tx_type = i;
        }
      }
      if (max_prob > tx_type_prob_threshold)  // force tx type with max prob.
        txk_allowed = force_tx_type;
      else if (x->rd_model == LOW_TXFM_RD) {
        if (plane == 0) txk_allowed = DCT_DCT;
      }
    }
  } else if (x->rd_model == LOW_TXFM_RD) {
    if (plane == 0) txk_allowed = DCT_DCT;
  }

  const TxSetType tx_set_type = av1_get_ext_tx_set_type(
      tx_size, is_inter, cm->features.reduced_tx_set_used);

  TX_TYPE uv_tx_type = DCT_DCT;
  if (plane) {
    // tx_type of PLANE_TYPE_UV should be the same as PLANE_TYPE_Y
    uv_tx_type = txk_allowed =
        av1_get_tx_type(xd, get_plane_type(plane), blk_row, blk_col, tx_size,
                        cm->features.reduced_tx_set_used);
  }
  PREDICTION_MODE intra_dir =
      mbmi->filter_intra_mode_info.use_filter_intra
          ? fimode_to_intradir[mbmi->filter_intra_mode_info.filter_intra_mode]
          : mbmi->mode;
  uint16_t ext_tx_used_flag =
      cpi->sf.tx_sf.tx_type_search.use_reduced_intra_txset != 0 &&
              tx_set_type == EXT_TX_SET_DTT4_IDTX_1DDCT
          ? av1_reduced_intra_tx_used_flag[intra_dir]
          : av1_ext_tx_used_flag[tx_set_type];

  if (cpi->sf.tx_sf.tx_type_search.use_reduced_intra_txset == 2)
    ext_tx_used_flag &= av1_derived_intra_tx_used_flag[intra_dir];

  if (xd->lossless[mbmi->segment_id] || txsize_sqr_up_map[tx_size] > TX_32X32 ||
      ext_tx_used_flag == 0x0001 ||
      (is_inter && cpi->oxcf.txfm_cfg.use_inter_dct_only) ||
      (!is_inter && cpi->oxcf.txfm_cfg.use_intra_dct_only)) {
    txk_allowed = DCT_DCT;
  }

  if (cpi->oxcf.txfm_cfg.enable_flip_idtx == 0)
    ext_tx_used_flag &= DCT_ADST_TX_MASK;

  uint16_t allowed_tx_mask = 0;  // 1: allow; 0: skip.
  if (txk_allowed < TX_TYPES) {
    allowed_tx_mask = 1 << txk_allowed;
    allowed_tx_mask &= ext_tx_used_flag;
  } else if (fast_tx_search) {
    allowed_tx_mask = 0x0c01;  // V_DCT, H_DCT, DCT_DCT
    allowed_tx_mask &= ext_tx_used_flag;
  } else {
    assert(plane == 0);
    allowed_tx_mask = ext_tx_used_flag;
    int num_allowed = 0;
    int i;

    if (cpi->sf.tx_sf.tx_type_search.prune_tx_type_using_stats) {
      static const int thresh_arr[2][7] = { { 10, 15, 15, 10, 15, 15, 15 },
                                            { 10, 17, 17, 10, 17, 17, 17 } };
      const int thresh =
          thresh_arr[cpi->sf.tx_sf.tx_type_search.prune_tx_type_using_stats - 1]
                    [update_type];
      uint16_t prune = 0;
      int max_prob = -1;
      int max_idx = 0;
      for (i = 0; i < TX_TYPES; i++) {
        if (tx_type_probs[i] > max_prob && (allowed_tx_mask & (1 << i))) {
          max_prob = tx_type_probs[i];
          max_idx = i;
        }
        if (tx_type_probs[i] < thresh) prune |= (1 << i);
      }
      if ((prune >> max_idx) & 0x01) prune &= ~(1 << max_idx);
      allowed_tx_mask &= (~prune);
    }
    for (i = 0; i < TX_TYPES; i++) {
      if (allowed_tx_mask & (1 << i)) num_allowed++;
    }
    assert(num_allowed > 0);

    if (num_allowed > 2 && cpi->sf.tx_sf.tx_type_search.prune_tx_type_est_rd) {
      int pf = prune_factors[txfm_params->prune_2d_txfm_mode];
      int mf = mul_factors[txfm_params->prune_2d_txfm_mode];
      if (num_allowed <= 7) {
        const uint16_t prune =
            prune_txk_type(cpi, x, plane, block, tx_size, blk_row, blk_col,
                           plane_bsize, txk_map, allowed_tx_mask, pf, txb_ctx,
                           cm->features.reduced_tx_set_used);
        allowed_tx_mask &= (~prune);
      } else {
        const int num_sel = (num_allowed * mf + 50) / 100;
        const uint16_t prune = prune_txk_type_separ(
            cpi, x, plane, block, tx_size, blk_row, blk_col, plane_bsize,
            txk_map, allowed_tx_mask, pf, txb_ctx,
            cm->features.reduced_tx_set_used, ref_best_rd, num_sel);

        allowed_tx_mask &= (~prune);
      }
    } else {
      assert(num_allowed > 0);
      int allowed_tx_count =
          (txfm_params->prune_2d_txfm_mode >= TX_TYPE_PRUNE_4) ? 1 : 5;
      // !fast_tx_search && txk_end != txk_start && plane == 0
      if (txfm_params->prune_2d_txfm_mode >= TX_TYPE_PRUNE_1 && is_inter &&
          num_allowed > allowed_tx_count) {
        prune_tx_2D(x, plane_bsize, tx_size, blk_row, blk_col, tx_set_type,
                    txfm_params->prune_2d_txfm_mode, txk_map, &allowed_tx_mask);
      }
    }
  }

  // Need to have at least one transform type allowed.
  if (allowed_tx_mask == 0) {
    txk_allowed = (plane ? uv_tx_type : DCT_DCT);
    allowed_tx_mask = (1 << txk_allowed);
  }

  assert(IMPLIES(txk_allowed < TX_TYPES, allowed_tx_mask == 1 << txk_allowed));
  *allowed_txk_types = txk_allowed;
  return allowed_tx_mask;
}